

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

_Bool Curl_meets_timecondition(Curl_easy *data,time_t timeofdoc)

{
  uchar uVar1;
  time_t timeofdoc_local;
  Curl_easy *data_local;
  
  if ((timeofdoc != 0) && ((data->set).timevalue != 0)) {
    uVar1 = (data->set).timecondition;
    if ((uVar1 == '\x01') || (uVar1 != '\x02')) {
      if (timeofdoc <= (data->set).timevalue) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"The requested document is not new enough");
        }
        (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfe | 1;
        return false;
      }
    }
    else if ((data->set).timevalue <= timeofdoc) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"The requested document is not old enough");
      }
      (data->info).field_0xe4 = (data->info).field_0xe4 & 0xfe | 1;
      return false;
    }
  }
  return true;
}

Assistant:

bool Curl_meets_timecondition(struct Curl_easy *data, time_t timeofdoc)
{
  if((timeofdoc == 0) || (data->set.timevalue == 0))
    return TRUE;

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    if(timeofdoc <= data->set.timevalue) {
      infof(data,
            "The requested document is not new enough");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    if(timeofdoc >= data->set.timevalue) {
      infof(data,
            "The requested document is not old enough");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  }

  return TRUE;
}